

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_get_reference_point.cc
# Opt level: O3

bool s2shapeutil::GetReferencePointAtVertex(S2Shape *shape,S2Point *vtest,ReferencePoint *result)

{
  btree_map<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256>
  *this;
  double dVar1;
  double dVar2;
  VType VVar3;
  uint uVar4;
  int iVar5;
  mapped_type *pmVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  Edge edge;
  S2ContainsVertexQuery contains_query;
  key_type local_98;
  key_type local_80;
  S2ContainsVertexQuery local_68;
  
  local_68.target_.c_[2] = vtest->c_[2];
  this = &local_68.edge_map_;
  local_68.target_.c_[0] = vtest->c_[0];
  local_68.target_.c_[1] = vtest->c_[1];
  local_68.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.root_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_2UL,_false>
  .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            )(Storage<absl::container_internal::CompressedTuple<std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_*>,_2UL,_false>
              )0x0;
  local_68.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)0x0;
  local_68.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  uVar4 = (*shape->_vptr_S2Shape[2])();
  if (0 < (int)uVar4) {
    uVar9 = 0;
    do {
      (*shape->_vptr_S2Shape[3])(&local_98,shape,uVar9);
      lVar7 = 0;
      do {
        dVar1 = *(double *)((long)local_98.c_ + lVar7);
        dVar2 = *(double *)((long)vtest->c_ + lVar7);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
        bVar10 = lVar7 != 0x10;
        lVar7 = lVar7 + 8;
      } while (bVar10);
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        pmVar6 = gtl::internal_btree::
                 btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                 ::operator[](&this->
                               super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                              ,&local_80);
        *pmVar6 = *pmVar6 + 1;
      }
      lVar7 = 0;
      do {
        dVar1 = *(double *)((long)local_80.c_ + lVar7);
        dVar2 = *(double *)((long)vtest->c_ + lVar7);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
        bVar10 = lVar7 != 0x10;
        lVar7 = lVar7 + 8;
      } while (bVar10);
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        pmVar6 = gtl::internal_btree::
                 btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                 ::operator[](&this->
                               super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                              ,&local_98);
        *pmVar6 = *pmVar6 + -1;
      }
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 != uVar4);
  }
  iVar5 = S2ContainsVertexQuery::ContainsSign(&local_68);
  if (iVar5 != 0) {
    (result->point).c_[2] = vtest->c_[2];
    VVar3 = vtest->c_[1];
    (result->point).c_[0] = vtest->c_[0];
    (result->point).c_[1] = VVar3;
    result->contained = 0 < iVar5;
  }
  gtl::internal_btree::
  btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  ::~btree((btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
            *)this);
  return iVar5 != 0;
}

Assistant:

static bool GetReferencePointAtVertex(
    const S2Shape& shape, const S2Point& vtest, ReferencePoint* result) {
  // Let P be an unbalanced vertex.  Vertex P is defined to be inside the
  // region if the region contains a particular direction vector starting from
  // P, namely the direction S2::Ortho(P).  This can be calculated using
  // S2ContainsVertexQuery.
  S2ContainsVertexQuery contains_query(vtest);
  int n = shape.num_edges();
  for (int e = 0; e < n; ++e) {
    auto edge = shape.edge(e);
    if (edge.v0 == vtest) contains_query.AddEdge(edge.v1, 1);
    if (edge.v1 == vtest) contains_query.AddEdge(edge.v0, -1);
  }
  int contains_sign = contains_query.ContainsSign();
  if (contains_sign == 0) {
    return false;  // There are no unmatched edges incident to this vertex.
  }
  result->point = vtest;
  result->contained = contains_sign > 0;
  return true;
}